

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

void * index234(tree234 *t,int index)

{
  node234_conflict *pnVar1;
  long lVar2;
  int iVar3;
  
  pnVar1 = t->root;
  if (-1 < index && pnVar1 != (node234_conflict *)0x0) {
    iVar3 = pnVar1->counts[3] + pnVar1->counts[1] + pnVar1->counts[2] + pnVar1->counts[0];
    lVar2 = 7;
    do {
      iVar3 = (iVar3 + 1) - (uint)(pnVar1->kids[lVar2 + -1] == (node234 *)0x0);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 10);
    if (index < iVar3) {
      do {
        lVar2 = 8;
        if (pnVar1->counts[0] <= index) {
          index = index + ~pnVar1->counts[0];
          if (index < 0) {
            lVar2 = 0x38;
LAB_0016d5f1:
            return *(void **)((long)pnVar1->kids + lVar2 + -8);
          }
          lVar2 = 0x10;
          if (pnVar1->counts[1] <= index) {
            index = index + ~pnVar1->counts[1];
            if (index < 0) {
              lVar2 = 0x40;
              goto LAB_0016d5f1;
            }
            lVar2 = 0x18;
            if (pnVar1->counts[2] <= index) {
              index = index + ~pnVar1->counts[2];
              lVar2 = 0x20;
              if (index < 0) {
                lVar2 = 0x48;
                goto LAB_0016d5f1;
              }
            }
          }
        }
        pnVar1 = *(node234_conflict **)((long)pnVar1->kids + lVar2 + -8);
        if (pnVar1 == (node234_conflict *)0x0) {
          return (void *)0x0;
        }
      } while( true );
    }
  }
  return (void *)0x0;
}

Assistant:

void *index234(tree234 * t, int index)
{
    node234 *n;

    if (!t->root)
        return NULL;                   /* tree is empty */

    if (index < 0 || index >= countnode234(t->root))
        return NULL;                   /* out of range */

    n = t->root;

    while (n) {
        if (index < n->counts[0])
            n = n->kids[0];
        else if (index -= n->counts[0] + 1, index < 0)
            return n->elems[0];
        else if (index < n->counts[1])
            n = n->kids[1];
        else if (index -= n->counts[1] + 1, index < 0)
            return n->elems[1];
        else if (index < n->counts[2])
            n = n->kids[2];
        else if (index -= n->counts[2] + 1, index < 0)
            return n->elems[2];
        else
            n = n->kids[3];
    }

    /* We shouldn't ever get here. I wonder how we did. */
    return NULL;
}